

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boolean.c
# Opt level: O2

LY_ERR lyplg_type_store_boolean
                 (ly_ctx *ctx,lysc_type *type,void *value,size_t value_len,uint32_t options,
                 LY_VALUE_FORMAT format,void *UNUSED_prefix_data,uint32_t hints,
                 lysc_node *UNUSED_ctx_node,lyd_value *storage,lys_glob_unres *UNUSED_unres,
                 ly_err_item **err)

{
  char cVar1;
  int8_t iVar2;
  LY_ERR LVar3;
  int iVar4;
  char *pcVar5;
  
  *(undefined8 *)((long)&storage->field_2 + 0x10) = 0;
  storage->_canonical = (char *)0x0;
  storage->realtype = (lysc_type *)0x0;
  (storage->field_2).dec64 = 0;
  *(undefined8 *)((long)&storage->field_2 + 8) = 0;
  storage->realtype = type;
  if (format == LY_VALUE_LYB) {
    if (value_len == 1) {
      cVar1 = *value;
      (storage->field_2).boolean = cVar1 != '\0';
      pcVar5 = "false";
      if (cVar1 != '\0') {
        pcVar5 = "true";
      }
      value_len = 0;
LAB_001adcf0:
      LVar3 = lydict_insert(ctx,pcVar5,value_len,&storage->_canonical);
    }
    else {
      pcVar5 = "Invalid LYB boolean value size %zu (expected 1).";
LAB_001add95:
      LVar3 = ly_err_new(err,LY_EVALID,LYVE_DATA,(char *)0x0,(char *)0x0,pcVar5,value_len);
    }
  }
  else {
    LVar3 = lyplg_type_check_hints(hints,(char *)value,value_len,type->basetype,(int *)0x0,err);
    if (LVar3 == LY_SUCCESS) {
      if (value_len == 5) {
        iVar4 = strncmp((char *)value,"false",5);
        if (iVar4 == 0) {
          iVar2 = '\0';
          goto LAB_001addd4;
        }
      }
      else if ((value_len == 4) && (iVar4 = strncmp((char *)value,"true",4), iVar4 == 0)) {
        iVar2 = '\x01';
LAB_001addd4:
        (storage->field_2).boolean = iVar2;
        pcVar5 = (char *)value;
        if ((options & 1) != 0) {
          LVar3 = lydict_insert_zc(ctx,(char *)value,&storage->_canonical);
          goto LAB_001addaf;
        }
        goto LAB_001adcf0;
      }
      pcVar5 = "Invalid boolean value \"%.*s\".";
      goto LAB_001add95;
    }
  }
  if ((options & 1) != 0) {
    free(value);
  }
LAB_001addaf:
  if (LVar3 != LY_SUCCESS) {
    lyplg_type_free_simple(ctx,storage);
  }
  return LVar3;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyplg_type_store_boolean(const struct ly_ctx *ctx, const struct lysc_type *type, const void *value, size_t value_len,
        uint32_t options, LY_VALUE_FORMAT format, void *UNUSED(prefix_data), uint32_t hints,
        const struct lysc_node *UNUSED(ctx_node), struct lyd_value *storage, struct lys_glob_unres *UNUSED(unres),
        struct ly_err_item **err)
{
    LY_ERR ret = LY_SUCCESS;
    int8_t i;

    /* init storage */
    memset(storage, 0, sizeof *storage);
    storage->realtype = type;

    if (format == LY_VALUE_LYB) {
        /* validation */
        if (value_len != 1) {
            ret = ly_err_new(err, LY_EVALID, LYVE_DATA, NULL, NULL, "Invalid LYB boolean value size %zu (expected 1).",
                    value_len);
            goto cleanup;
        }

        /* store value */
        i = *(int8_t *)value;
        storage->boolean = i ? 1 : 0;

        /* store canonical value, it always is */
        ret = lydict_insert(ctx, i ? "true" : "false", 0, &storage->_canonical);
        LY_CHECK_GOTO(ret, cleanup);

        /* success */
        goto cleanup;
    }

    /* check hints */
    ret = lyplg_type_check_hints(hints, value, value_len, type->basetype, NULL, err);
    LY_CHECK_GOTO(ret, cleanup);

    /* validate and store the value */
    if ((value_len == ly_strlen_const("true")) && !strncmp(value, "true", ly_strlen_const("true"))) {
        i = 1;
    } else if ((value_len == ly_strlen_const("false")) && !strncmp(value, "false", ly_strlen_const("false"))) {
        i = 0;
    } else {
        ret = ly_err_new(err, LY_EVALID, LYVE_DATA, NULL, NULL, "Invalid boolean value \"%.*s\".", (int)value_len,
                (char *)value);
        goto cleanup;
    }
    storage->boolean = i;

    /* store canonical value, it always is */
    if (options & LYPLG_TYPE_STORE_DYNAMIC) {
        ret = lydict_insert_zc(ctx, (char *)value, &storage->_canonical);
        options &= ~LYPLG_TYPE_STORE_DYNAMIC;
        LY_CHECK_GOTO(ret, cleanup);
    } else {
        ret = lydict_insert(ctx, value, value_len, &storage->_canonical);
        LY_CHECK_GOTO(ret, cleanup);
    }

cleanup:
    if (options & LYPLG_TYPE_STORE_DYNAMIC) {
        free((char *)value);
    }

    if (ret) {
        lyplg_type_free_simple(ctx, storage);
    }
    return ret;
}